

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionOneofOptions_Test
::TestBody(RetentionStripTest_StripSourceRetentionOneofOptions_Test *this)

{
  FileDescriptor *this_00;
  bool bVar1;
  Descriptor *this_01;
  DescriptorProto *this_02;
  OneofDescriptorProto *pOVar2;
  char *pcVar3;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher_00;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher_01;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher_02;
  AssertHelper local_788;
  Message local_780;
  OneofOptions local_778;
  OneofOptions local_728;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> local_6d8;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  local_688;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_3;
  Message local_620;
  OneofDescriptorProto local_618;
  OneofOptions local_5f0;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> local_5a0;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  local_550;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_2;
  Message local_4e8;
  DescriptorProto local_4e0;
  OneofOptions local_3f0;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> local_3a0;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  local_350;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_1;
  Message local_2e8;
  FileDescriptorProto local_2e0;
  OneofOptions local_1e8;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> local_198;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  local_148;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  OneofDescriptor *local_d8;
  OneofDescriptor *local_d0;
  OneofDescriptor *oneof;
  string_view local_b8;
  Descriptor *local_a8;
  Descriptor *local_a0;
  Descriptor *message;
  undefined1 local_88 [8];
  OneofOptions expected_options;
  string_view local_28;
  FileDescriptor *local_18;
  FileDescriptor *file;
  RetentionStripTest_StripSourceRetentionOneofOptions_Test *this_local;
  
  file = (FileDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "\n      message TestMessage {\n        oneof test_oneof {\n        option (source_retention_option) = 123;\n        option (options) = {\n          i1: 123\n          i2: 456\n          c { s: \"abc\" }\n          rc { s: \"abc\" }\n        };\n        option (repeated_options) = {\n          i1: 111 i2: 222\n        };\n          string field1 = 1;\n          string field2 = 2;\n        };\n      }\n\n      message Options {\n        optional int32 i1 = 1 [retention = RETENTION_SOURCE];\n        optional int32 i2 = 2;\n        message ChildMessage {\n          optional string s = 1 [retention = RETENTION_SOURCE];\n        }\n        optional ChildMessage c = 3;\n        repeated ChildMessage rc = 4;\n      }\n\n      extend google.protobuf.OneofOptions {\n        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];\n        optional Options options = 50001;\n        repeated Options repeated_options = 50002;\n      }"
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&expected_options.field_0 + 0x38),"foo.proto");
  local_18 = RetentionStripTest::ParseSchema
                       (&this->super_RetentionStripTest,local_28,stack0xffffffffffffffc8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&message,
             "\n        [google.protobuf.internal.options] {\n          i2: 456\n          c {}\n          rc {}\n        }\n        [google.protobuf.internal.repeated_options] { i2: 222 }"
            );
  RetentionStripTest::BuildDynamicProto<google::protobuf::OneofOptions>
            ((OneofOptions *)local_88,&this->super_RetentionStripTest,_message);
  this_00 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"TestMessage");
  local_a8 = FileDescriptor::FindMessageTypeByName(this_00,local_b8);
  this_01 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::Descriptor_const*>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                       ,0x1f8,"file->FindMessageTypeByName(\"TestMessage\")",&local_a8);
  local_a0 = this_01;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"test_oneof");
  local_d8 = Descriptor::FindOneofByName(this_01,stack0xffffffffffffff18);
  local_d0 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::OneofDescriptor_const*>
                       ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                        ,0x1fa,"message->FindOneofByName(\"test_oneof\")",&local_d8);
  OneofOptions::OneofOptions(&local_1e8,(OneofOptions *)local_88);
  EqualsProto<google::protobuf::OneofOptions>(&local_198,&local_1e8);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
            (&local_148,(internal *)&local_198,matcher);
  StripSourceRetentionOptions(&local_2e0,local_18,false);
  this_02 = FileDescriptorProto::message_type(&local_2e0,0);
  pOVar2 = DescriptorProto::oneof_decl(this_02,0);
  OneofDescriptorProto::options(pOVar2);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
  ::operator()(local_f8,(char *)&local_148,
               (OneofOptions *)
               "StripSourceRetentionOptions(*file) .message_type(0) .oneof_decl(0) .options()");
  FileDescriptorProto::~FileDescriptorProto(&local_2e0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  ::~PredicateFormatterFromMatcher(&local_148);
  EqualsProtoMatcherP<google::protobuf::OneofOptions>::~EqualsProtoMatcherP(&local_198);
  OneofOptions::~OneofOptions(&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x200,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  OneofOptions::OneofOptions(&local_3f0,(OneofOptions *)local_88);
  EqualsProto<google::protobuf::OneofOptions>(&local_3a0,&local_3f0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
            (&local_350,(internal *)&local_3a0,matcher_00);
  StripSourceRetentionOptions(&local_4e0,local_a0);
  pOVar2 = DescriptorProto::oneof_decl(&local_4e0,0);
  OneofDescriptorProto::options(pOVar2);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
  ::operator()(local_300,(char *)&local_350,
               (OneofOptions *)"StripSourceRetentionOptions(*message).oneof_decl(0).options()");
  DescriptorProto::~DescriptorProto(&local_4e0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  ::~PredicateFormatterFromMatcher(&local_350);
  EqualsProtoMatcherP<google::protobuf::OneofOptions>::~EqualsProtoMatcherP(&local_3a0);
  OneofOptions::~OneofOptions(&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x202,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  OneofOptions::OneofOptions(&local_5f0,(OneofOptions *)local_88);
  EqualsProto<google::protobuf::OneofOptions>(&local_5a0,&local_5f0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
            (&local_550,(internal *)&local_5a0,matcher_01);
  StripSourceRetentionOptions(&local_618,local_d0);
  OneofDescriptorProto::options(&local_618);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
  ::operator()(local_500,(char *)&local_550,
               (OneofOptions *)"StripSourceRetentionOptions(*oneof).options()");
  OneofDescriptorProto::~OneofDescriptorProto(&local_618);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  ::~PredicateFormatterFromMatcher(&local_550);
  EqualsProtoMatcherP<google::protobuf::OneofOptions>::~EqualsProtoMatcherP(&local_5a0);
  OneofOptions::~OneofOptions(&local_5f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_620);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  OneofOptions::OneofOptions(&local_728,(OneofOptions *)local_88);
  EqualsProto<google::protobuf::OneofOptions>(&local_6d8,&local_728);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
            (&local_688,(internal *)&local_6d8,matcher_02);
  StripLocalSourceRetentionOptions(&local_778,local_d0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
  ::operator()(local_638,(char *)&local_688,
               (OneofOptions *)"StripLocalSourceRetentionOptions(*oneof)");
  OneofOptions::~OneofOptions(&local_778);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  ::~PredicateFormatterFromMatcher(&local_688);
  EqualsProtoMatcherP<google::protobuf::OneofOptions>::~EqualsProtoMatcherP(&local_6d8);
  OneofOptions::~OneofOptions(&local_728);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x206,pcVar3);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  OneofOptions::~OneofOptions((OneofOptions *)local_88);
  return;
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionOneofOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      message TestMessage {
        oneof test_oneof {
        option (source_retention_option) = 123;
        option (options) = {
          i1: 123
          i2: 456
          c { s: "abc" }
          rc { s: "abc" }
        };
        option (repeated_options) = {
          i1: 111 i2: 222
        };
          string field1 = 1;
          string field2 = 2;
        };
      }

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.OneofOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  OneofOptions expected_options = BuildDynamicProto<OneofOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");
  const Descriptor* message =
      ABSL_DIE_IF_NULL(file->FindMessageTypeByName("TestMessage"));
  const OneofDescriptor* oneof =
      ABSL_DIE_IF_NULL(message->FindOneofByName("test_oneof"));

  EXPECT_THAT(StripSourceRetentionOptions(*file)
                  .message_type(0)
                  .oneof_decl(0)
                  .options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*message).oneof_decl(0).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*oneof).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*oneof),
              EqualsProto(expected_options));
}